

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

bool __thiscall
gss::innards::HomomorphismSearcher::propagate
          (HomomorphismSearcher *this,bool initial,Domains *new_domains,
          HomomorphismAssignments *assignments,bool propagate_using_lackey)

{
  size_t *psVar1;
  uint *puVar2;
  pointer *ppHVar3;
  bool *pbVar4;
  pointer plVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  HomomorphismAssignmentInformation *pHVar9;
  iterator __position;
  Proof *this_00;
  undefined8 uVar10;
  pointer pHVar11;
  Lackey *this_01;
  undefined1 auVar12 [16];
  byte bVar13;
  bool bVar14;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  _Var15;
  pointer pHVar16;
  _List_node_base *p_Var17;
  pointer pHVar18;
  pointer pHVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  SVOBitset *pSVar22;
  _Self __tmp_1;
  pointer plVar23;
  pointer plVar24;
  undefined7 in_register_00000031;
  long lVar25;
  pointer __args;
  long lVar26;
  ulong uVar27;
  undefined7 in_register_00000081;
  _Self __tmp;
  undefined1 (*pauVar28) [16];
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range2;
  bool wipeout;
  optional<gss::innards::HomomorphismAssignment> current_assignment;
  int dcount;
  VertexToVertexMapping mapping;
  byte local_ed;
  uint local_ec;
  Domains *local_e8;
  allocator_type local_dd;
  undefined4 local_dc;
  pointer local_d8;
  HomomorphismSearcher *local_d0;
  _Storage<gss::innards::HomomorphismAssignment,_true> local_c8;
  undefined1 local_c0;
  long local_b8;
  ulong local_b0;
  _Storage<gss::innards::HomomorphismAssignment,_true> local_a8;
  undefined4 local_9c;
  _Any_data local_98;
  code *pcStack_88;
  code *apcStack_80 [3];
  _Storage<gss::innards::HomomorphismAssignment,_true> local_68;
  _Rb_tree_color _Stack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined8 local_40;
  pointer local_38;
  
  local_dc = (undefined4)CONCAT71(in_register_00000081,propagate_using_lackey);
  local_e8 = new_domains;
  local_d0 = this;
  if (((int)CONCAT71(in_register_00000031,initial) != 0) &&
     (bVar14 = might_have_watches(this->params), bVar14)) {
    local_38 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_d8 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_d8 != local_38) {
      do {
        uVar6 = (local_d8->assignment).pattern_vertex;
        uVar7 = (local_d8->assignment).target_vertex;
        local_a8._M_value.pattern_vertex = uVar6;
        local_b0 = CONCAT44(local_b0._4_4_,uVar7);
        plVar5 = (this->watches).table.data.
                 super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 ((this->watches).table.target_size * uVar6 + uVar7);
        plVar23 = *(pointer *)
                   &(plVar5->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                    )._M_impl._M_node;
        if (plVar23 != plVar5) {
          local_ec = 0;
          do {
            sVar8 = *(size_t *)
                     ((long)&(plVar23->
                             super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                             )._M_impl._M_node + 0x10);
            pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
            if ((*(uint *)*pauVar20 != local_a8._0_4_) || (*(int *)(*pauVar20 + 4) != (int)local_b0)
               ) {
              auVar12 = vpermilps_avx(*pauVar20,0x4e);
              *pauVar20 = auVar12;
              pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
            }
            pauVar28 = pauVar20 + 1;
            if (pauVar28 != *(undefined1 (**) [16])(sVar8 + 0x18)) {
              do {
                pHVar9 = (assignments->values).
                         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                _Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<gss::innards::HomomorphismAssignmentInformation_const*,std::vector<gss::innards::HomomorphismAssignmentInformation,std::allocator<gss::innards::HomomorphismAssignmentInformation>>>,__gnu_cxx::__ops::_Iter_pred<gss::innards::HomomorphismAssignments::contains(gss::innards::HomomorphismAssignment_const&)const::_lambda(auto:1_const&)_1_>>
                                   ((assignments->values).
                                    super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                                    ._M_impl.super__Vector_impl_data._M_start,pHVar9,pauVar28);
                if (_Var15._M_current == pHVar9) {
                  uVar10 = **(undefined8 **)(sVar8 + 0x10);
                  **(undefined8 **)(sVar8 + 0x10) = *(undefined8 *)*pauVar28;
                  *(undefined8 *)*pauVar28 = uVar10;
                  uVar6 = (local_d0->watches).table.target_size;
                  plVar24 = (local_d0->watches).table.data.
                            super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar10 = **(undefined8 **)(sVar8 + 0x10);
                  p_Var17 = (_List_node_base *)operator_new(0x18);
                  p_Var17[1]._M_next =
                       *(_List_node_base **)
                        ((long)&(plVar23->
                                super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                                )._M_impl._M_node + 0x10);
                  std::__detail::_List_node_base::_M_hook(p_Var17);
                  psVar1 = (size_t *)
                           ((long)&plVar24[uVar6 * (int)uVar10 + (int)((ulong)uVar10 >> 0x20)].
                                   super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                                   ._M_impl._M_node + 0x10);
                  *psVar1 = *psVar1 + 1;
                  plVar24 = *(pointer *)
                             &(plVar23->
                              super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                              )._M_impl._M_node;
                  psVar1 = (size_t *)
                           ((long)&(plVar5->
                                   super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                                   )._M_impl._M_node + 0x10);
                  *psVar1 = *psVar1 - 1;
                  std::__detail::_List_node_base::_M_unhook();
                  operator_delete(plVar23,0x18);
                  goto LAB_0013953f;
                }
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
              } while (pauVar28 != *(undefined1 (**) [16])(sVar8 + 0x18));
              pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
            }
            pHVar16 = (local_e8->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pHVar18 = (local_e8->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if (pHVar16 != pHVar18) {
              uVar6 = *(uint *)(*pauVar20 + 0xc);
              do {
                if (pHVar16->v == *(uint *)(*pauVar20 + 8)) {
                  if ((pHVar16->values).n_words < 0x11) {
                    pSVar22 = &pHVar16->values;
                  }
                  else {
                    pSVar22 = (SVOBitset *)(pHVar16->values)._data.short_data[0];
                  }
                  uVar7 = uVar6 + 0x3f;
                  if (-1 < (int)uVar6) {
                    uVar7 = uVar6;
                  }
                  if (((pSVar22->_data).short_data[(int)uVar7 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) !=
                      0) {
                    (pSVar22->_data).short_data[(int)uVar7 >> 6] =
                         ~(1L << ((ulong)uVar6 & 0x3f)) &
                         (pSVar22->_data).short_data[(int)uVar7 >> 6];
                    puVar2 = &pHVar16->count;
                    *puVar2 = *puVar2 - 1;
                    local_ec = CONCAT31((int3)(local_ec >> 8),(byte)local_ec | *puVar2 == 0);
                  }
                  break;
                }
                pHVar16 = pHVar16 + 1;
              } while (pHVar16 != pHVar18);
            }
            plVar24 = *(pointer *)
                       &(plVar23->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                        )._M_impl._M_node;
LAB_0013953f:
            plVar23 = plVar24;
          } while (plVar24 != plVar5);
          if ((local_ec & 1) != 0) {
            return false;
          }
        }
        local_d8 = local_d8 + 1;
        this = local_d0;
      } while (local_d8 != local_38);
    }
  }
  pHVar16 = (local_e8->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pHVar18 = (local_e8->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar26 = (long)pHVar18 - (long)pHVar16;
  lVar25 = (lVar26 >> 3) * -0x79435e50d79435e5 >> 2;
  if (0 < lVar25) {
    lVar26 = lVar25 + 1;
    pHVar19 = pHVar16 + 2;
    do {
      if ((pHVar19[-2].fixed == false) && (pHVar19[-2].count == 1)) {
        pHVar19 = pHVar19 + -2;
        goto LAB_00139697;
      }
      if ((pHVar19[-1].fixed == false) && (pHVar19[-1].count == 1)) {
        pHVar19 = pHVar19 + -1;
        goto LAB_00139697;
      }
      if ((pHVar19->fixed == false) && (pHVar19->count == 1)) goto LAB_00139697;
      if ((pHVar19[1].fixed == false) && (pHVar19[1].count == 1)) {
        pHVar19 = pHVar19 + 1;
        goto LAB_00139697;
      }
      lVar26 = lVar26 + -1;
      pHVar19 = pHVar19 + 4;
    } while (1 < lVar26);
    lVar26 = (long)pHVar18 - (long)(pHVar16 + lVar25 * 4);
    pHVar16 = pHVar16 + lVar25 * 4;
  }
  lVar25 = (lVar26 >> 3) * -0x79435e50d79435e5;
  if (lVar25 != 1) {
    pHVar19 = pHVar16;
    if (lVar25 != 2) {
      pHVar19 = pHVar18;
      if ((lVar25 != 3) || ((pHVar16->fixed == false && (pHVar19 = pHVar16, pHVar16->count == 1))))
      goto LAB_00139697;
      pHVar19 = pHVar16 + 1;
    }
    if ((pHVar19->fixed == false) && (pHVar19->count == 1)) goto LAB_00139697;
    pHVar16 = pHVar19 + 1;
  }
  pHVar19 = pHVar16;
  if (pHVar16->count != 1) {
    pHVar19 = pHVar18;
  }
  if (pHVar16->fixed != false) {
    pHVar19 = pHVar18;
  }
LAB_00139697:
  bVar14 = pHVar19 == pHVar18;
  local_d8 = (pointer)&this->proof;
LAB_001396a6:
  local_c0 = 0;
  if (!bVar14) {
    uVar21 = (ulong)(pHVar19->values).n_words;
    if (uVar21 < 0x11) {
      pSVar22 = &pHVar19->values;
    }
    else {
      pSVar22 = (SVOBitset *)(pHVar19->values)._data.short_data[0];
    }
    uVar27 = 0xffffffff00000000;
    if (uVar21 != 0) {
      lVar25 = 0;
LAB_001396ec:
      uVar27 = (pSVar22->_data).short_data[0];
      if (uVar27 == 0) goto code_r0x001396f4;
      uVar6 = 0;
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        uVar6 = uVar6 + 1;
      }
      uVar27 = (ulong)(uVar6 | (uint)lVar25) << 0x20;
    }
    goto LAB_0013971b;
  }
  goto LAB_001399f0;
code_r0x001396f4:
  lVar25 = lVar25 + 0x40;
  pSVar22 = (SVOBitset *)((long)&pSVar22->_data + 8);
  if (uVar21 << 6 == lVar25) goto code_r0x00139701;
  goto LAB_001396ec;
code_r0x00139701:
  uVar27 = 0xffffffff00000000;
LAB_0013971b:
  local_c0 = 1;
  local_c8 = (_Storage<gss::innards::HomomorphismAssignment,_true>)(pHVar19->v | uVar27);
  pHVar19->fixed = true;
  _Stack_60 = _Stack_60 & 0xffffff00;
  uStack_5c = 0xffffffff;
  uStack_58 = 0xffffffff;
  __position._M_current =
       (assignments->values).
       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = local_c8;
  if (__position._M_current ==
      (assignments->values).
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
              (&assignments->values,__position,
               (HomomorphismAssignmentInformation *)&local_68._M_value);
  }
  else {
    (__position._M_current)->choice_count = -1;
    (__position._M_current)->assignment = (HomomorphismAssignment)local_c8;
    (__position._M_current)->is_decision = (bool)(char)_Stack_60;
    *(int3 *)&(__position._M_current)->field_0x9 = (int3)(_Stack_60 >> 8);
    (__position._M_current)->discrepancy_count = 0xffffffff;
    ppHVar3 = &(assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar3 = *ppHVar3 + 1;
  }
  this_00 = ((__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&local_d8->assignment)
            ->_M_ptr;
  if (this_00 != (Proof *)0x0) {
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)&local_68._M_value,this->model,local_c8._M_value.pattern_vertex);
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)&local_98,this->model,local_c8._M_value.target_vertex);
    Proof::unit_propagating(this_00,(NamedVertex *)&local_68._M_value,(NamedVertex *)&local_98);
    if ((code **)local_98._8_8_ != apcStack_80) {
      operator_delete((void *)local_98._8_8_,(ulong)(apcStack_80[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_5c,_Stack_60) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_5c,_Stack_60),local_50._M_allocated_capacity + 1);
    }
  }
  bVar14 = might_have_watches(this->params);
  if (bVar14) {
    local_a8._M_value = local_c8._M_value;
    local_b0 = (ulong)local_c8 >> 0x20;
    plVar5 = (this->watches).table.data.
             super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             ((this->watches).table.target_size * local_c8._M_value.pattern_vertex +
             local_c8._M_value.target_vertex);
    plVar23 = *(pointer *)
               &(plVar5->
                super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                )._M_impl._M_node;
    if (plVar23 != plVar5) {
      local_ec = 0;
      do {
        sVar8 = *(size_t *)
                 ((long)&(plVar23->
                         super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                         )._M_impl._M_node + 0x10);
        pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
        if ((*(uint *)*pauVar20 != local_a8._M_value.pattern_vertex) ||
           (*(int *)(*pauVar20 + 4) != (int)local_b0)) {
          auVar12 = vpermilps_avx(*pauVar20,0x4e);
          *pauVar20 = auVar12;
          pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
        }
        pauVar28 = pauVar20 + 1;
        if (pauVar28 != *(undefined1 (**) [16])(sVar8 + 0x18)) {
          do {
            pHVar9 = (assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            _Var15 = std::
                     __find_if<__gnu_cxx::__normal_iterator<gss::innards::HomomorphismAssignmentInformation_const*,std::vector<gss::innards::HomomorphismAssignmentInformation,std::allocator<gss::innards::HomomorphismAssignmentInformation>>>,__gnu_cxx::__ops::_Iter_pred<gss::innards::HomomorphismAssignments::contains(gss::innards::HomomorphismAssignment_const&)const::_lambda(auto:1_const&)_1_>>
                               ((assignments->values).
                                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                                ._M_impl.super__Vector_impl_data._M_start,pHVar9,pauVar28);
            if (_Var15._M_current == pHVar9) {
              uVar10 = **(undefined8 **)(sVar8 + 0x10);
              **(undefined8 **)(sVar8 + 0x10) = *(undefined8 *)*pauVar28;
              *(undefined8 *)*pauVar28 = uVar10;
              uVar6 = (local_d0->watches).table.target_size;
              plVar24 = (local_d0->watches).table.data.
                        super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = **(undefined8 **)(sVar8 + 0x10);
              p_Var17 = (_List_node_base *)operator_new(0x18);
              p_Var17[1]._M_next =
                   *(_List_node_base **)
                    ((long)&(plVar23->
                            super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                            )._M_impl._M_node + 0x10);
              std::__detail::_List_node_base::_M_hook(p_Var17);
              psVar1 = (size_t *)
                       ((long)&plVar24[uVar6 * (int)uVar10 + (int)((ulong)uVar10 >> 0x20)].
                               super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                               ._M_impl._M_node + 0x10);
              *psVar1 = *psVar1 + 1;
              plVar24 = *(pointer *)
                         &(plVar23->
                          super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                          )._M_impl._M_node;
              psVar1 = (size_t *)
                       ((long)&(plVar5->
                               super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                               )._M_impl._M_node + 0x10);
              *psVar1 = *psVar1 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(plVar23,0x18);
              goto LAB_001399bd;
            }
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
          } while (pauVar28 != *(undefined1 (**) [16])(sVar8 + 0x18));
          pauVar20 = *(undefined1 (**) [16])(sVar8 + 0x10);
        }
        pHVar16 = (local_e8->
                  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pHVar18 = (local_e8->
                  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (pHVar16 != pHVar18) {
          uVar6 = *(uint *)(*pauVar20 + 0xc);
          do {
            if ((pHVar16->fixed == false) && (pHVar16->v == *(uint *)(*pauVar20 + 8))) {
              if ((pHVar16->values).n_words < 0x11) {
                pSVar22 = &pHVar16->values;
              }
              else {
                pSVar22 = (SVOBitset *)(pHVar16->values)._data.short_data[0];
              }
              uVar7 = uVar6 + 0x3f;
              if (-1 < (int)uVar6) {
                uVar7 = uVar6;
              }
              if (((pSVar22->_data).short_data[(int)uVar7 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0)
              {
                (pSVar22->_data).short_data[(int)uVar7 >> 6] =
                     ~(1L << ((ulong)uVar6 & 0x3f)) & (pSVar22->_data).short_data[(int)uVar7 >> 6];
                puVar2 = &pHVar16->count;
                *puVar2 = *puVar2 - 1;
                local_ec = CONCAT31((int3)(local_ec >> 8),(byte)local_ec | *puVar2 == 0);
              }
              break;
            }
            pHVar16 = pHVar16 + 1;
          } while (pHVar16 != pHVar18);
        }
        plVar24 = *(pointer *)
                   &(plVar23->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                    )._M_impl._M_node;
LAB_001399bd:
        plVar23 = plVar24;
      } while (plVar24 != plVar5);
      this = local_d0;
      if ((local_ec & 1) != 0) {
        return false;
      }
    }
  }
  bVar14 = propagate_simple_constraints(this,local_e8,&local_c8._M_value);
  if (!bVar14) {
    return false;
  }
LAB_001399f0:
  bVar14 = HomomorphismModel::has_less_thans(this->model);
  if ((bVar14) && (bVar14 = propagate_less_thans(this,local_e8), !bVar14)) {
    return false;
  }
  bVar14 = HomomorphismModel::has_occur_less_thans(this->model);
  if ((bVar14) &&
     (bVar14 = propagate_occur_less_thans
                         (this,(optional<gss::innards::HomomorphismAssignment> *)&local_c8._M_value,
                          assignments,local_e8), !bVar14)) {
    return false;
  }
  if ((this->params->injectivity == Injective) &&
     (bVar14 = cheap_all_different(this->model->target_size,local_e8,
                                   (shared_ptr<gss::innards::Proof> *)local_d8,this->model), !bVar14
     )) {
    return false;
  }
  pHVar19 = (local_e8->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pHVar16 = (local_e8->
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar26 = (long)pHVar16 - (long)pHVar19;
  lVar25 = (lVar26 >> 3) * -0x79435e50d79435e5 >> 2;
  if (0 < lVar25) {
    lVar26 = lVar25 + 1;
    pHVar18 = pHVar19 + lVar25 * 4;
    pHVar19 = pHVar19 + 2;
    do {
      if ((pHVar19[-2].fixed == false) && (pHVar19[-2].count == 1)) {
        pHVar19 = pHVar19 + -2;
        goto LAB_00139b8a;
      }
      if ((pHVar19[-1].fixed == false) && (pHVar19[-1].count == 1)) {
        pHVar19 = pHVar19 + -1;
        goto LAB_00139b8a;
      }
      if ((pHVar19->fixed == false) && (pHVar19->count == 1)) goto LAB_00139b8a;
      if ((pHVar19[1].fixed == false) && (pHVar19[1].count == 1)) {
        pHVar19 = pHVar19 + 1;
        goto LAB_00139b8a;
      }
      lVar26 = lVar26 + -1;
      pHVar19 = pHVar19 + 4;
    } while (1 < lVar26);
    lVar26 = (long)pHVar16 - (long)pHVar18;
    pHVar19 = pHVar18;
  }
  lVar25 = (lVar26 >> 3) * -0x79435e50d79435e5;
  if (lVar25 != 1) {
    if (lVar25 != 2) {
      if (lVar25 != 3) goto LAB_00139b95;
      if ((pHVar19->fixed == false) && (pHVar19->count == 1)) goto LAB_00139b8a;
      pHVar19 = pHVar19 + 1;
    }
    if ((pHVar19->fixed == false) && (pHVar19->count == 1)) goto LAB_00139b8a;
    pHVar19 = pHVar19 + 1;
  }
  pHVar18 = pHVar19;
  if (pHVar19->count != 1) {
    pHVar18 = pHVar16;
  }
  pbVar4 = &pHVar19->fixed;
  pHVar19 = pHVar18;
  if (*pbVar4 != false) {
    pHVar19 = pHVar16;
  }
LAB_00139b8a:
  bVar14 = false;
  if (pHVar19 == pHVar16) goto LAB_00139b95;
  goto LAB_001396a6;
LAB_00139b95:
  local_9c = 0;
  if ((this->params->lackey)._M_t.
      super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t.
      super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
      super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0) {
    return true;
  }
  if (((char)local_dc == '\0') && (this->params->send_partials_to_lackey != true)) {
    return true;
  }
  local_50._M_allocated_capacity = (size_type)&_Stack_60;
  _Stack_60 = _S_red;
  uStack_58 = 0;
  uStack_54 = 0;
  local_40 = 0;
  __args = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar11 = (assignments->values).
            super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_50._8_8_ = local_50._M_allocated_capacity;
  if (__args != pHVar11) {
    do {
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)&local_68._M_value,(uint *)__args,&(__args->assignment).target_vertex);
      __args = __args + 1;
    } while (__args != pHVar11);
  }
  if ((char)local_dc == '\0') {
    local_98._M_unused._M_object = (long *)0x0;
    local_98._8_8_ = 0;
    pcStack_88 = (code *)0x0;
    apcStack_80[0] = (code *)0x0;
    bVar14 = Lackey::check_solution
                       ((this->params->lackey)._M_t.
                        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                        .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl,
                        (VertexToVertexMapping *)&local_68._M_value,true,false,
                        (function<bool_(int,_int)> *)&local_98);
    if (pcStack_88 != (code *)0x0) {
      (*pcStack_88)(&local_98,&local_98,__destroy_functor);
    }
    if (!bVar14) goto LAB_00139d95;
  }
  else {
    local_ed = 0;
    local_98._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_c8._M_value,
               (ulong)this->model->pattern_size,(value_type_conflict1 *)local_98._M_pod_data,
               &local_dd);
    pHVar16 = (local_e8->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar25 = (long)(local_e8->
                   super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar16;
    if (lVar25 != 0) {
      uVar21 = (lVar25 >> 3) * -0x79435e50d79435e5;
      uVar27 = 0;
      do {
        puVar2 = &pHVar16->v;
        pHVar16 = pHVar16 + 1;
        *(int *)((long)local_c8 + (ulong)*puVar2 * 4) = (int)uVar27;
        uVar27 = (ulong)((int)uVar27 + 1);
      } while (uVar27 <= uVar21 && uVar21 - uVar27 != 0);
    }
    this_01 = (this->params->lackey)._M_t.
              super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
              .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    *(byte **)local_98._M_unused._0_8_ = &local_ed;
    *(_Storage<gss::innards::HomomorphismAssignment,_true> **)((long)local_98._M_unused._0_8_ + 8) =
         &local_c8;
    apcStack_80[0] =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
         ::_M_invoke;
    *(Domains **)((long)local_98._M_unused._0_8_ + 0x10) = local_e8;
    *(undefined4 **)((long)local_98._M_unused._0_8_ + 0x18) = &local_9c;
    pcStack_88 = std::
                 _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
                 ::_M_manager;
    bVar14 = Lackey::check_solution
                       (this_01,(VertexToVertexMapping *)&local_68._M_value,true,false,
                        (function<bool_(int,_int)> *)&local_98);
    bVar13 = local_ed;
    if (pcStack_88 != (code *)0x0) {
      (*pcStack_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_c8 != (_Storage<gss::innards::HomomorphismAssignment,_true>)0x0) {
      operator_delete((void *)local_c8,local_b8 - (long)local_c8);
    }
    if (!bVar14 || (bVar13 & 1) != 0) {
LAB_00139d95:
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&local_68._M_value);
      return false;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&local_68._M_value);
  return true;
}

Assistant:

auto HomomorphismSearcher::propagate(bool initial, Domains & new_domains, HomomorphismAssignments & assignments, bool propagate_using_lackey) -> bool
{
    // nogoods might be watching things in initial assignments. this is possibly not the
    // best place to put this...
    if (initial && might_have_watches(params)) {
        for (auto & a : assignments.values) {
            HomomorphismAssignment current_assignment = {a.assignment.pattern_vertex, a.assignment.target_vertex};
            bool wipeout = false;
            watches.propagate(
                current_assignment,
                [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                [&](const HomomorphismAssignment & a) {
                    for (auto & d : new_domains) {
                        if (d.v == a.pattern_vertex) {
                            if (d.values.test(a.target_vertex)) {
                                d.values.reset(a.target_vertex);
                                if (0 == --d.count)
                                    wipeout = true;
                            }
                            break;
                        }
                    }
                });

            if (wipeout)
                return false;
        }
    }

    auto find_unit_domain = [&]() {
        return find_if(new_domains.begin(), new_domains.end(), [](HomomorphismDomain & d) {
            return (! d.fixed) && 1 == d.count;
        });
    };

    bool done_globals_at_least_once = false;

    // whilst we've got a unit domain...
    for (typename Domains::iterator branch_domain = find_unit_domain();
         branch_domain != new_domains.end() || ! done_globals_at_least_once;
         branch_domain = find_unit_domain()) {
        optional<HomomorphismAssignment> current_assignment;
        if (branch_domain != new_domains.end()) {
            // what are we assigning?
            current_assignment = HomomorphismAssignment{branch_domain->v, unsigned(branch_domain->values.find_first())};

            // ok, make the assignment
            branch_domain->fixed = true;
            assignments.values.push_back({*current_assignment, false, -1, -1});

            if (proof)
                proof->unit_propagating(
                    model.pattern_vertex_for_proof(current_assignment->pattern_vertex),
                    model.target_vertex_for_proof(current_assignment->target_vertex));

            // propagate watches
            if (might_have_watches(params)) {
                bool wipeout = false;
                watches.propagate(
                    *current_assignment,
                    [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                    [&](const HomomorphismAssignment & a) {
                        for (auto & d : new_domains) {
                            if (d.fixed)
                                continue;

                            if (d.v == a.pattern_vertex) {
                                if (d.values.test(a.target_vertex)) {
                                    d.values.reset(a.target_vertex);
                                    if (0 == --d.count)
                                        wipeout = true;
                                }
                                break;
                            }
                        }
                    });

                if (wipeout)
                    return false;
            }

            // propagate simple all different and adjacency
            if (! propagate_simple_constraints(new_domains, *current_assignment))
                return false;
        }

        // propagate less thans
        if (model.has_less_thans() && ! propagate_less_thans(new_domains))
            return false;
        if (model.has_occur_less_thans() && ! propagate_occur_less_thans(current_assignment, assignments, new_domains))
            return false;

        // propagate all different
        if (params.injectivity == Injectivity::Injective)
            if (! cheap_all_different(model.target_size, new_domains, proof, &model))
                return false;
        done_globals_at_least_once = true;
    }

    int dcount = 0;
    if (params.lackey && (propagate_using_lackey || params.send_partials_to_lackey)) {
        VertexToVertexMapping mapping;
        expand_to_full_result(assignments, mapping);

        if (! propagate_using_lackey) {
            if (! params.lackey->check_solution(mapping, true, false, Lackey::DeletionFunction{}))
                return false;
        }
        else {
            bool wipeout = false;
            vector<int> find_domain(model.pattern_size, -1);
            for (unsigned i = 0; i < new_domains.size(); ++i)
                find_domain[new_domains[i].v] = i;

            auto deletion = [&](int p, int t) -> bool {
                if (! wipeout) {
                    if (int d = find_domain[p]; d != -1) {
                        if (new_domains[d].values.test(t)) {
                            ++dcount;
                            new_domains[d].values.reset(t);
                            if (0 == --new_domains[d].count)
                                wipeout = true;
                            return true;
                        }
                    }
                }
                return false;
            };

            if (! params.lackey->check_solution(mapping, true, false, deletion) || wipeout)
                return false;
        }
    }

    return true;
}